

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FindDbName(sqlite3 *db,char *zName)

{
  int iVar1;
  Db *local_28;
  Db *pDb;
  int i;
  char *zName_local;
  sqlite3 *db_local;
  
  pDb._4_4_ = -1;
  if (zName != (char *)0x0) {
    pDb._4_4_ = db->nDb + -1;
    local_28 = db->aDb + pDb._4_4_;
    while (((-1 < pDb._4_4_ && (iVar1 = sqlite3_stricmp(local_28->zDbSName,zName), iVar1 != 0)) &&
           ((pDb._4_4_ != 0 || (iVar1 = sqlite3_stricmp("main",zName), iVar1 != 0))))) {
      pDb._4_4_ = pDb._4_4_ + -1;
      local_28 = local_28 + -1;
    }
  }
  return pDb._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindDbName(sqlite3 *db, const char *zName){
  int i = -1;         /* Database number */
  if( zName ){
    Db *pDb;
    for(i=(db->nDb-1), pDb=&db->aDb[i]; i>=0; i--, pDb--){
      if( 0==sqlite3_stricmp(pDb->zDbSName, zName) ) break;
      /* "main" is always an acceptable alias for the primary database
      ** even if it has been renamed using SQLITE_DBCONFIG_MAINDBNAME. */
      if( i==0 && 0==sqlite3_stricmp("main", zName) ) break;
    }
  }
  return i;
}